

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O1

bool __thiscall
duckdb::TopNHeap::CheckBoundaryValues
          (TopNHeap *this,DataChunk *sort_chunk,DataChunk *payload,
          TopNBoundaryValue *global_boundary)

{
  DataChunk *pDVar1;
  DataChunk *this_00;
  SelectionVector *false_sel;
  pointer __src;
  Vector *pVVar2;
  vector<duckdb::BoundOrderByNode,_true> *this_01;
  pointer pBVar3;
  pointer pBVar4;
  TopNHeap *pTVar5;
  ulong uVar6;
  int iVar7;
  reference pvVar8;
  reference pvVar9;
  const_reference pvVar10;
  idx_t iVar11;
  Vector *col;
  Vector *this_02;
  vector<duckdb::OrderModifiers,_true> *in_R9;
  idx_t iVar12;
  SelectionVector *pSVar13;
  idx_t i;
  ulong uVar14;
  bool bVar15;
  string_t sort_key;
  SelectionVector remaining_sel;
  string current_boundary_val;
  SelectionVector local_a0;
  TopNHeap *local_88;
  ulong local_80;
  uint local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  optional_ptr<duckdb::SelectionVector,_true> local_68;
  DataChunk *local_60;
  buffer_ptr<SelectionData> *local_58;
  string local_50;
  
  TopNBoundaryValue::GetBoundaryValue_abi_cxx11_(&local_50,global_boundary);
  if (local_50._M_string_length == 0) {
    bVar15 = true;
  }
  else {
    local_88 = this;
    if ((local_50._M_string_length != (this->boundary_val)._M_string_length) ||
       (iVar7 = bcmp(local_50._M_dataplus._M_p,(this->boundary_val)._M_dataplus._M_p,
                     local_50._M_string_length), iVar7 != 0)) {
      ::std::__cxx11::string::operator=((string *)&this->boundary_val,(string *)&local_50);
      pTVar5 = local_88;
      pDVar1 = &local_88->boundary_values;
      DataChunk::Reset(pDVar1);
      __src = (pTVar5->boundary_val)._M_dataplus._M_p;
      local_78 = (uint)(pTVar5->boundary_val)._M_string_length;
      if (local_78 < 0xd) {
        uStack_6c = 0;
        uStack_74 = 0;
        uStack_70 = 0;
        if (local_78 != 0) {
          switchD_012dd528::default(&uStack_74,__src,(ulong)(local_78 & 0xf));
        }
      }
      else {
        uStack_74 = *(undefined4 *)__src;
        uStack_70 = SUB84(__src,0);
        uStack_6c = (undefined4)((ulong)__src >> 0x20);
      }
      sort_key.value._4_1_ = (undefined1)uStack_6c;
      sort_key.value._5_1_ = uStack_6c._1_1_;
      sort_key.value._6_1_ = uStack_6c._2_1_;
      sort_key.value._7_1_ = uStack_6c._3_1_;
      sort_key.value.pointer.length = uStack_70;
      sort_key.value.pointer.ptr = (char *)pDVar1;
      CreateSortKeyHelpers::DecodeSortKey
                ((CreateSortKeyHelpers *)CONCAT44(uStack_74,local_78),sort_key,(DataChunk *)0x0,
                 (idx_t)&pTVar5->modifiers,in_R9);
      pVVar2 = (pTVar5->boundary_values).data.
               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (this_02 = (pTVar5->boundary_values).data.
                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start; this_02 != pVVar2; this_02 = this_02 + 1) {
        Vector::SetVectorType(this_02,CONSTANT_VECTOR);
      }
    }
    (local_88->boundary_values).count = sort_chunk->count;
    local_a0.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a0.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    pDVar1 = &local_88->boundary_values;
    local_a0.sel_vector = (sel_t *)0x0;
    iVar12 = sort_chunk->count;
    this_00 = &local_88->compare_chunk;
    pSVar13 = &local_88->true_sel;
    false_sel = &local_88->false_sel;
    local_68.ptr = &local_88->new_remaining_sel;
    local_58 = &(local_88->new_remaining_sel).selection_data;
    local_80 = 0;
    uVar14 = 0;
    local_60 = payload;
    while (pTVar5 = local_88,
          uVar14 < (ulong)(((long)(local_88->orders->
                                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                  ).
                                  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_88->orders->
                                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                  ).
                                  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555)) {
      if (local_a0.sel_vector == (sel_t *)0x0) {
        pvVar8 = vector<duckdb::Vector,_true>::operator[](&this_00->data,uVar14);
        pvVar9 = vector<duckdb::Vector,_true>::operator[](&sort_chunk->data,uVar14);
        Vector::Reference(pvVar8,pvVar9);
      }
      else {
        pvVar8 = vector<duckdb::Vector,_true>::operator[](&this_00->data,uVar14);
        pvVar9 = vector<duckdb::Vector,_true>::operator[](&sort_chunk->data,uVar14);
        Vector::Slice(pvVar8,pvVar9,&local_a0,iVar12);
      }
      this_01 = pTVar5->orders;
      pBVar3 = (this_01->
               super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
               super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pBVar4 = (this_01->
               super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
               super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar10 = vector<duckdb::BoundOrderByNode,_true>::operator[](this_01,uVar14);
      if (pvVar10->null_order == NULLS_LAST) {
        pvVar10 = vector<duckdb::BoundOrderByNode,_true>::operator[](pTVar5->orders,uVar14);
        if (pvVar10->type == ASCENDING) {
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&this_00->data,uVar14);
          pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,uVar14);
          iVar11 = VectorOperations::DistinctLessThan
                             (pvVar8,pvVar9,&local_a0,iVar12,
                              (optional_ptr<duckdb::SelectionVector,_true>)pSVar13,
                              (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                              (optional_ptr<duckdb::ValidityMask,_true>)0x0);
        }
        else {
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&this_00->data,uVar14);
          pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,uVar14);
          iVar11 = VectorOperations::DistinctGreaterThanNullsFirst
                             (pvVar8,pvVar9,&local_a0,iVar12,
                              (optional_ptr<duckdb::SelectionVector,_true>)pSVar13,
                              (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                              (optional_ptr<duckdb::ValidityMask,_true>)0x0);
        }
      }
      else {
        pvVar10 = vector<duckdb::BoundOrderByNode,_true>::operator[](pTVar5->orders,uVar14);
        if (pvVar10->type == ASCENDING) {
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&this_00->data,uVar14);
          pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,uVar14);
          iVar11 = VectorOperations::DistinctLessThanNullsFirst
                             (pvVar8,pvVar9,&local_a0,iVar12,
                              (optional_ptr<duckdb::SelectionVector,_true>)pSVar13,
                              (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                              (optional_ptr<duckdb::ValidityMask,_true>)0x0);
        }
        else {
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&this_00->data,uVar14);
          pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,uVar14);
          iVar11 = VectorOperations::DistinctGreaterThan
                             (pvVar8,pvVar9,&local_a0,iVar12,
                              (optional_ptr<duckdb::SelectionVector,_true>)pSVar13,
                              (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                              (optional_ptr<duckdb::ValidityMask,_true>)0x0);
        }
      }
      uVar6 = local_80;
      if (iVar11 != 0) {
        switchD_012dd528::default
                  ((pTVar5->final_sel).sel_vector + local_80,(pTVar5->true_sel).sel_vector,
                   iVar11 * 4);
        local_80 = uVar6 + iVar11;
      }
      iVar12 = iVar12 - iVar11;
      if (iVar12 == 0 || uVar14 + 1 == ((long)pBVar3 - (long)pBVar4 >> 3) * -0x5555555555555555)
      break;
      pvVar8 = vector<duckdb::Vector,_true>::operator[](&this_00->data,uVar14);
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&sort_chunk->data,uVar14);
      Vector::Slice(pvVar8,pvVar9,false_sel,iVar12);
      pvVar8 = vector<duckdb::Vector,_true>::operator[](&this_00->data,uVar14);
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,uVar14);
      iVar12 = VectorOperations::NotDistinctFrom
                         (pvVar8,pvVar9,(optional_ptr<const_duckdb::SelectionVector,_true>)false_sel
                          ,iVar12,local_68,(optional_ptr<duckdb::SelectionVector,_true>)0x0);
      shared_ptr<duckdb::SelectionData,_true>::operator=(&local_a0.selection_data,local_58);
      local_a0.sel_vector = (local_68.ptr)->sel_vector;
      uVar14 = uVar14 + 1;
    }
    uVar14 = local_80;
    bVar15 = local_80 != 0;
    if ((bVar15) && (local_80 < sort_chunk->count)) {
      pSVar13 = &local_88->final_sel;
      DataChunk::Slice(sort_chunk,pSVar13,local_80);
      DataChunk::Slice(local_60,pSVar13,uVar14);
    }
    if (local_a0.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return bVar15;
}

Assistant:

bool TopNHeap::CheckBoundaryValues(DataChunk &sort_chunk, DataChunk &payload, TopNBoundaryValue &global_boundary) {
	// get the global boundary value
	auto current_boundary_val = global_boundary.GetBoundaryValue();
	if (current_boundary_val.empty()) {
		// no boundary value (yet) - don't do anything
		return true;
	}
	if (current_boundary_val != boundary_val) {
		// new boundary value - decode
		boundary_val = std::move(current_boundary_val);
		boundary_values.Reset();
		CreateSortKeyHelpers::DecodeSortKey(string_t(boundary_val), boundary_values, 0, modifiers);
		for (auto &col : boundary_values.data) {
			col.SetVectorType(VectorType::CONSTANT_VECTOR);
		}
	}
	boundary_values.SetCardinality(sort_chunk.size());

	// we have boundary values
	// from these boundary values, determine which values we should insert (if any)
	idx_t final_count = 0;

	SelectionVector remaining_sel(nullptr);
	idx_t remaining_count = sort_chunk.size();
	for (idx_t i = 0; i < orders.size(); i++) {
		if (remaining_sel.data()) {
			compare_chunk.data[i].Slice(sort_chunk.data[i], remaining_sel, remaining_count);
		} else {
			compare_chunk.data[i].Reference(sort_chunk.data[i]);
		}
		bool is_last = i + 1 == orders.size();
		idx_t true_count;
		if (orders[i].null_order == OrderByNullType::NULLS_LAST) {
			if (orders[i].type == OrderType::ASCENDING) {
				true_count = VectorOperations::DistinctLessThan(compare_chunk.data[i], boundary_values.data[i],
				                                                &remaining_sel, remaining_count, &true_sel, &false_sel);
			} else {
				true_count = VectorOperations::DistinctGreaterThanNullsFirst(compare_chunk.data[i],
				                                                             boundary_values.data[i], &remaining_sel,
				                                                             remaining_count, &true_sel, &false_sel);
			}
		} else {
			D_ASSERT(orders[i].null_order == OrderByNullType::NULLS_FIRST);
			if (orders[i].type == OrderType::ASCENDING) {
				true_count = VectorOperations::DistinctLessThanNullsFirst(compare_chunk.data[i],
				                                                          boundary_values.data[i], &remaining_sel,
				                                                          remaining_count, &true_sel, &false_sel);
			} else {
				true_count =
				    VectorOperations::DistinctGreaterThan(compare_chunk.data[i], boundary_values.data[i],
				                                          &remaining_sel, remaining_count, &true_sel, &false_sel);
			}
		}

		if (true_count > 0) {
			memcpy(final_sel.data() + final_count, true_sel.data(), true_count * sizeof(sel_t));
			final_count += true_count;
		}
		idx_t false_count = remaining_count - true_count;
		if (!is_last && false_count > 0) {
			// check what we should continue to check
			compare_chunk.data[i].Slice(sort_chunk.data[i], false_sel, false_count);
			remaining_count = VectorOperations::NotDistinctFrom(compare_chunk.data[i], boundary_values.data[i],
			                                                    &false_sel, false_count, &new_remaining_sel, nullptr);
			remaining_sel.Initialize(new_remaining_sel);
		} else {
			break;
		}
	}
	if (final_count == 0) {
		return false;
	}
	if (final_count < sort_chunk.size()) {
		sort_chunk.Slice(final_sel, final_count);
		payload.Slice(final_sel, final_count);
	}
	return true;
}